

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_tu(bitstream *str,h264_cabac_context *cabac,int *ctxIdx,int numidx,uint32_t cMax,
                 uint32_t *val)

{
  int iVar1;
  int in_ECX;
  h264_cabac_context *in_RDX;
  undefined8 in_RSI;
  uint32_t *in_RDI;
  uint in_R8D;
  uint *in_R9;
  uint32_t tmp_1;
  int i_1;
  uint32_t tmp;
  int i;
  uint32_t *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  h264_cabac_context *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar2;
  uint local_3c;
  uint local_34;
  int local_4;
  
  if (*in_RDI == 0) {
    if (in_R8D < *in_R9) {
      fprintf(_stderr,"TU value over limit\n");
      local_4 = 1;
    }
    else {
      for (local_34 = 0; local_34 <= *in_R9 && local_34 < in_R8D; local_34 = local_34 + 1) {
        uVar2 = local_34;
        if (in_ECX <= (int)local_34) {
          uVar2 = in_ECX - 1;
        }
        iVar1 = h264_cabac_decision((bitstream *)CONCAT44(uVar2,in_stack_ffffffffffffff98),
                                    in_stack_ffffffffffffff90,
                                    (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                    in_stack_ffffffffffffff80);
        if (iVar1 != 0) {
          return 1;
        }
      }
      local_4 = 0;
    }
  }
  else {
    for (local_3c = 0; local_3c < in_R8D; local_3c = local_3c + 1) {
      iVar1 = h264_cabac_decision((bitstream *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                  in_RDX,(int)((ulong)in_RSI >> 0x20),in_RDI);
      if (iVar1 != 0) {
        return 1;
      }
    }
    *in_R9 = local_3c;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int h264_cabac_tu(struct bitstream *str, struct h264_cabac_context *cabac, int *ctxIdx, int numidx, uint32_t cMax, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		int i;
		if (*val > cMax) {
			fprintf(stderr, "TU value over limit\n");
			return 1;
		}
		for (i = 0; i <= *val && i < cMax; i++) {
			uint32_t tmp = i < *val;
			if (h264_cabac_decision(str, cabac, ctxIdx[i >= numidx ? numidx - 1 : i], &tmp)) return 1;
		}
		return 0;
	} else {
		int i;
		uint32_t tmp = 1;
		for (i = 0; i < cMax; i++) {
			if (h264_cabac_decision(str, cabac, ctxIdx[i >= numidx ? numidx - 1 : i], &tmp)) return 1;
			if (!tmp)
				break;
		}
		*val = i;
		return 0;		
	}
}